

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O3

void __thiscall
github111116::ConsoleLogger::
warn<char[15],nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          (ConsoleLogger *this,char (*args) [15],
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *args_1)

{
  int iVar1;
  
  if (2 < this->loglevel) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,(this->warnColor)._M_dataplus._M_p,(this->warnColor)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"[!] ",4);
    print<char[15],nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (this,args,args_1);
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->out,"\x1b[0m",4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}